

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::provokingVertex(ReferenceContext *this,deUint32 convention)

{
  deUint32 convention_local;
  ReferenceContext *this_local;
  
  if (convention == 0x8e4d) {
    this->m_provokingFirstVertexConvention = true;
  }
  else if (convention == 0x8e4e) {
    this->m_provokingFirstVertexConvention = false;
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::provokingVertex (deUint32 convention)
{
	// only in core
	DE_ASSERT(glu::isContextTypeGLCore(getType()));

	switch (convention)
	{
		case GL_FIRST_VERTEX_CONVENTION:	m_provokingFirstVertexConvention = true; break;
		case GL_LAST_VERTEX_CONVENTION:		m_provokingFirstVertexConvention = false; break;

		default:
			RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}
}